

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_sort(secp256k1_context *ctx,secp256k1_pubkey **pubkeys,size_t n_pubkeys)

{
  secp256k1_callback *in_RDX;
  _func_int_void_ptr_void_ptr_void_ptr *in_RSI;
  size_t in_RDI;
  void *unaff_retaddr;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/secp256k1.c"
            ,0x144,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI != (_func_int_void_ptr_void_ptr_void_ptr *)0x0) {
    secp256k1_hsort(unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    in_RDI,in_RSI,in_RDX);
  }
  else {
    secp256k1_callback_call(in_RDX,in_stack_ffffffffffffffd8);
  }
  return (uint)(in_RSI != (_func_int_void_ptr_void_ptr_void_ptr *)0x0);
}

Assistant:

int secp256k1_ec_pubkey_sort(const secp256k1_context* ctx, const secp256k1_pubkey **pubkeys, size_t n_pubkeys) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkeys != NULL);

    /* Suppress wrong warning (fixed in MSVC 19.33) */
    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(push)
    #pragma warning(disable: 4090)
    #endif

    /* Casting away const is fine because neither secp256k1_hsort nor
     * secp256k1_ec_pubkey_sort_cmp modify the data pointed to by the cmp_data
     * argument. */
    secp256k1_hsort(pubkeys, n_pubkeys, sizeof(*pubkeys), secp256k1_ec_pubkey_sort_cmp, (void *)ctx);

    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(pop)
    #endif

    return 1;
}